

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O2

void __thiscall IsoWriter::writeImpUseDescriptor(IsoWriter *this)

{
  uint8_t *buffer;
  int iVar1;
  ulong uVar2;
  size_t in_RCX;
  uint32_t *buff32;
  allocator<char> local_41;
  string impId;
  
  buffer = this->m_buffer;
  memset(buffer,0,0x800);
  uVar2 = (this->m_file).m_pos;
  iVar1 = this->m_tagLocationBaseAddr;
  this->m_buffer[0] = '\x04';
  this->m_buffer[1] = '\0';
  this->m_buffer[2] = '\x03';
  this->m_buffer[3] = '\0';
  this->m_buffer[6] = '\x01';
  this->m_buffer[7] = '\0';
  *(int *)(this->m_buffer + 0xc) = (int)(uVar2 >> 0xb) - iVar1;
  this->m_buffer[0x10] = '\x01';
  this->m_buffer[0x11] = '\0';
  this->m_buffer[0x12] = '\0';
  this->m_buffer[0x13] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&impId,"*UDF LV Info",&local_41);
  this->m_buffer[0x14] = '\0';
  anon_unknown.dwarf_cd2a3::writeUDFString(this->m_buffer + 0x14,impId._M_dataplus._M_p,0x20);
  this->m_buffer[0x34] = '\0';
  this->m_buffer[0x45] = 'U';
  this->m_buffer[0x46] = 'n';
  this->m_buffer[0x47] = 'i';
  this->m_buffer[0x48] = 'c';
  this->m_buffer[0x49] = 'o';
  this->m_buffer[0x4a] = 'd';
  this->m_buffer[0x4b] = 'e';
  this->m_buffer[0x4c] = '\0';
  this->m_buffer[0x35] = 'O';
  this->m_buffer[0x36] = 'S';
  this->m_buffer[0x37] = 'T';
  this->m_buffer[0x38] = 'A';
  this->m_buffer[0x39] = ' ';
  this->m_buffer[0x3a] = 'C';
  this->m_buffer[0x3b] = 'o';
  this->m_buffer[0x3c] = 'm';
  this->m_buffer[0x3d] = 'p';
  this->m_buffer[0x3e] = 'r';
  this->m_buffer[0x3f] = 'e';
  this->m_buffer[0x40] = 's';
  this->m_buffer[0x41] = 's';
  this->m_buffer[0x42] = 'e';
  this->m_buffer[0x43] = 'd';
  this->m_buffer[0x44] = ' ';
  anon_unknown.dwarf_cd2a3::writeDString
            (this->m_buffer + 0x74,(this->m_volumeLabel)._M_dataplus._M_p,0x80);
  strcpy((char *)(this->m_buffer + 0x161),(this->m_impId)._M_dataplus._M_p);
  strcpy((char *)(this->m_buffer + 0x180),(this->m_appId)._M_dataplus._M_p);
  anon_unknown.dwarf_cd2a3::calcDescriptorCRC(buffer,0x200);
  File::write(&this->m_file,(int)buffer,(void *)0x800,in_RCX);
  std::__cxx11::string::~string((string *)&impId);
  return;
}

Assistant:

void IsoWriter::writeImpUseDescriptor()
{
    memset(m_buffer, 0, sizeof(m_buffer));
    writeDescriptorTag(m_buffer, DescriptorTag::ImplUseVol, absoluteSectorNum());

    const auto buff32 = reinterpret_cast<uint32_t *>(m_buffer);
    buff32[4] = 0x01;  // Descriptor Sequence Number

    const std::string impId = std::string("*UDF LV Info");
    m_buffer[20] = 0x00;
    writeUDFString(m_buffer + 20, impId.c_str(), 32);

    // Explanatory Character Set
    m_buffer[52] = 0x00;  // CS0 coded character set
    strcpy(reinterpret_cast<char *>(m_buffer) + 53, "OSTA Compressed Unicode");

    // logical volume identifier
    writeDString(m_buffer + 116, m_volumeLabel.c_str(), 128);

    strcpy(reinterpret_cast<char *>(m_buffer) + 0x161, m_impId.c_str());  // ImplementationID
    strcpy(reinterpret_cast<char *>(m_buffer) + 0x180, m_appId.c_str());  // ImplementationUse

    calcDescriptorCRC(m_buffer, 512);
    m_file.write(m_buffer, SECTOR_SIZE);
}